

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

int tlstran_listener_get(void *arg,char *name,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  
  iVar1 = nni_stream_listener_get(*(nng_stream_listener **)((long)arg + 0x60),name,buf,szp,t);
  if (iVar1 == 9) {
    iVar1 = nni_getopt(tlstran_ep_options,name,arg,buf,szp,t);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int
tlstran_listener_get(
    void *arg, const char *name, void *buf, size_t *szp, nni_type t)
{
	int         rv;
	tlstran_ep *ep = arg;

	rv = nni_stream_listener_get(ep->listener, name, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_getopt(tlstran_ep_options, name, ep, buf, szp, t);
	}
	return (rv);
}